

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O0

Fraig_Node_t * Fraig_NodeCreatePi(Fraig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Fraig_Node_t *Entry;
  uint *puVar3;
  abctime aVar4;
  abctime aVar5;
  Fraig_Node_t *pFVar6;
  abctime clk;
  int i;
  Fraig_Node_t *pNodeRes;
  Fraig_Node_t *pNode;
  Fraig_Man_t *p_local;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  puVar3 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = puVar3;
  Entry->puSimD = Entry->puSimR + p->nWordsRand;
  memset(Entry->puSimD,0,(long)p->nWordsDyna << 2);
  Entry->Num = p->vNodes->nSize;
  Fraig_NodeVecPush(p->vNodes,Entry);
  Entry->NumPi = p->vInputs->nSize;
  Fraig_NodeVecPush(p->vInputs,Entry);
  Entry->Level = 0;
  Entry->nRefs = 1;
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfffffffe;
  aVar4 = Abc_Clock();
  Entry->uHashR = 0;
  for (clk._4_4_ = 0; clk._4_4_ < p->nWordsRand; clk._4_4_ = clk._4_4_ + 1) {
    uVar1 = Aig_ManRandom(0);
    Entry->puSimR[clk._4_4_] = uVar1;
    if (clk._4_4_ == 0) {
      *Entry->puSimR = *Entry->puSimR << 1;
    }
    Entry->uHashR = Entry->puSimR[clk._4_4_] * s_FraigPrimes[clk._4_4_] ^ Entry->uHashR;
  }
  iVar2 = Fraig_BitStringCountOnes(Entry->puSimR,p->nWordsRand);
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfff | iVar2 << 0xc;
  Entry->uHashD = 0;
  for (clk._4_4_ = 0; clk._4_4_ < p->iWordStart; clk._4_4_ = clk._4_4_ + 1) {
    uVar1 = Aig_ManRandom(0);
    Entry->puSimD[clk._4_4_] = uVar1;
    Entry->uHashD = Entry->puSimD[clk._4_4_] * s_FraigPrimes[clk._4_4_] ^ Entry->uHashD;
  }
  aVar5 = Abc_Clock();
  p->timeSims = (aVar5 - aVar4) + p->timeSims;
  pFVar6 = Fraig_HashTableLookupF(p,Entry);
  if (pFVar6 == (Fraig_Node_t *)0x0) {
    return Entry;
  }
  __assert_fail("pNodeRes == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigNode.c"
                ,0x8f,"Fraig_Node_t *Fraig_NodeCreatePi(Fraig_Man_t *)");
}

Assistant:

Fraig_Node_t * Fraig_NodeCreatePi( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode, * pNodeRes;
    int i;
    abctime clk;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    memset( pNode->puSimD, 0, sizeof(unsigned) * p->nWordsDyna );

    // assign the number and add to the array of nodes
    pNode->Num   = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );

    // assign the PI number and add to the array of primary inputs
    pNode->NumPi = p->vInputs->nSize;   
    Fraig_NodeVecPush( p->vInputs, pNode );

    pNode->Level =  0;  // PI has 0 level
    pNode->nRefs =  1;  // it is a persistent node, which comes referenced
    pNode->fInv  =  0;  // the simulation info of the PI is not complemented

    // derive the simulation info for the new node
clk = Abc_Clock();
    // set the random simulation info for the primary input
    pNode->uHashR = 0;
    for ( i = 0; i < p->nWordsRand; i++ )
    {
        // generate the simulation info
        pNode->puSimR[i] = FRAIG_RANDOM_UNSIGNED;
        // for reasons that take very long to explain, it makes sense to have (0000000...) 
        // pattern in the set (this helps if we need to return the counter-examples)
        if ( i == 0 )
            pNode->puSimR[i] <<= 1;
        // compute the hash key
        pNode->uHashR ^= pNode->puSimR[i] * s_FraigPrimes[i];
    }
    // count the number of ones in the simulation vector
    pNode->nOnes = Fraig_BitStringCountOnes( pNode->puSimR, p->nWordsRand );

    // set the systematic simulation info for the primary input
    pNode->uHashD = 0;
    for ( i = 0; i < p->iWordStart; i++ )
    {
        // generate the simulation info
        pNode->puSimD[i] = FRAIG_RANDOM_UNSIGNED;
        // compute the hash key
        pNode->uHashD ^= pNode->puSimD[i] * s_FraigPrimes[i];
    }
p->timeSims += Abc_Clock() - clk;

    // insert it into the hash table
    pNodeRes = Fraig_HashTableLookupF( p, pNode );
    assert( pNodeRes == NULL );
    // add to the runtime of simulation
    return pNode;
}